

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O2

bool __thiscall llvm::yaml::Scanner::scanBlockEntry(Scanner *this)

{
  Token local_50;
  
  rollIndent(this,this->Column,TK_BlockSequenceStart,(iterator)&(this->TokenQueue).List);
  removeSimpleKeyCandidatesOnFlowLevel(this,this->FlowLevel);
  this->IsSimpleKeyAllowed = true;
  local_50.Value._M_dataplus._M_p = (pointer)&local_50.Value.field_2;
  local_50.Value._M_string_length = 0;
  local_50.Value.field_2._M_local_buf[0] = '\0';
  local_50.Kind = TK_BlockEntry;
  local_50.Range.Data = this->Current;
  local_50.Range.Length = 1;
  skip(this,1);
  AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>
  ::push_back(&this->TokenQueue,&local_50);
  std::__cxx11::string::_M_dispose();
  return true;
}

Assistant:

bool Scanner::scanBlockEntry() {
  rollIndent(Column, Token::TK_BlockSequenceStart, TokenQueue.end());
  removeSimpleKeyCandidatesOnFlowLevel(FlowLevel);
  IsSimpleKeyAllowed = true;
  Token T;
  T.Kind = Token::TK_BlockEntry;
  T.Range = StringRef(Current, 1);
  skip(1);
  TokenQueue.push_back(T);
  return true;
}